

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O1

void pbrt::CPURender(ParsedScene *parsedScene)

{
  SceneEntity *name;
  _Rb_tree_node_base *__k;
  FileLoc *loc;
  FileLoc *loc_00;
  CameraTransform *cameraTransform;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *loc_01;
  SceneEntity *name_00;
  pointer *ppPVar1;
  pointer pSVar2;
  pointer ppVar3;
  pointer pLVar4;
  pointer pIVar5;
  Transform *pTVar6;
  RGBColorSpace *colorSpace;
  ParsedScene *pPVar7;
  pointer pPVar8;
  pointer pPVar9;
  bool bVar10;
  int iVar11;
  iterator iVar12;
  iterator iVar13;
  BVHAggregate *this;
  mapped_type *pmVar14;
  _Rb_tree_node_base *p_Var15;
  undefined8 *puVar16;
  AnimatedPrimitive *this_00;
  SceneEntity *mtl;
  ParameterDictionary *this_01;
  pointer pSVar17;
  pointer __k_00;
  bool bVar18;
  uintptr_t uVar19;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>
  *namedMtl;
  pointer ppVar20;
  string *__k_01;
  key_type *__k_02;
  pointer pLVar21;
  long in_FS_OFFSET;
  bool bVar22;
  Float FVar23;
  Float FVar24;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> instancePrimitives;
  bool haveScatteringMedia;
  ParsedScene *local_308;
  Allocator alloc;
  PrimitiveHandle bvh;
  anon_class_16_2_f001ee1d findMedium;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> primitives;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> lights;
  unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> integrator;
  pointer local_288;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_280;
  CameraHandle camera;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> local_270;
  vector<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_> materials;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> animatedPrimitives;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_220;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_218;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_210;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_208;
  SamplerHandle sampler;
  FilmHandle film;
  FilterHandle filter;
  anon_class_56_7_455aa864 CreatePrimitivesForShapes;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> local_1b0;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> local_198;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
  instanceDefinitions;
  anon_class_56_7_455aa864 CreatePrimitivesForAnimatedShapes;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
  namedMaterials;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
  floatTextures;
  TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm> local_b8;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_b0;
  TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
  local_a8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
  spectrumTextures;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
  media;
  anon_class_16_2_c82bbf6a getAlphaTexture;
  
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  ParsedScene::CreateMedia_abi_cxx11_(&media,parsedScene,alloc);
  findMedium.haveScatteringMedia = &haveScatteringMedia;
  haveScatteringMedia = false;
  findMedium.media = &media;
  FilterHandle::Create
            (&filter,&(parsedScene->filter).name,&(parsedScene->filter).parameters,
             &(parsedScene->filter).loc,alloc);
  CreatePrimitivesForShapes.alloc = (Allocator *)&CreatePrimitivesForShapes.namedMaterials;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&CreatePrimitivesForShapes,"shutterclose","");
  this_01 = &(parsedScene->camera).super_SceneEntity.parameters;
  local_308 = parsedScene;
  FVar23 = ParameterDictionary::GetOneFloat(this_01,(string *)&CreatePrimitivesForShapes,1.0);
  CreatePrimitivesForAnimatedShapes.alloc =
       (Allocator *)&CreatePrimitivesForAnimatedShapes.namedMaterials;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&CreatePrimitivesForAnimatedShapes,"shutteropen","");
  FVar24 = ParameterDictionary::GetOneFloat
                     (this_01,(string *)&CreatePrimitivesForAnimatedShapes,0.0);
  if (CreatePrimitivesForAnimatedShapes.alloc !=
      (Allocator *)&CreatePrimitivesForAnimatedShapes.namedMaterials) {
    operator_delete(CreatePrimitivesForAnimatedShapes.alloc,
                    (ulong)&((CreatePrimitivesForAnimatedShapes.namedMaterials)->_M_t)._M_impl.
                            field_0x1);
  }
  if (CreatePrimitivesForShapes.alloc != (Allocator *)&CreatePrimitivesForShapes.namedMaterials) {
    operator_delete(CreatePrimitivesForShapes.alloc,
                    (ulong)&((CreatePrimitivesForShapes.namedMaterials)->_M_t)._M_impl.field_0x1);
  }
  pPVar7 = local_308;
  if (FVar23 - FVar24 <= 0.0) {
    ErrorExit(&(local_308->camera).super_SceneEntity.loc,
              "The specified camera shutter times imply that the shutter does not open.  A black image will result."
             );
  }
  name = &local_308->film;
  local_a8 = filter.
             super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
             .bits;
  loc = &(local_308->film).loc;
  FilmHandle::Create(&film,&name->name,&(local_308->film).parameters,FVar23 - FVar24,
                     (FilterHandle *)&local_a8,loc,alloc);
  loc_00 = &(pPVar7->camera).super_SceneEntity.loc;
  if ((pPVar7->camera).medium._M_string_length == 0) {
    local_b0.bits = 0;
  }
  else {
    __k_01 = &(pPVar7->camera).medium;
    iVar12 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
             ::find(&(findMedium.media)->_M_t,__k_01);
    if ((_Rb_tree_header *)iVar12._M_node ==
        &((findMedium.media)->_M_t)._M_impl.super__Rb_tree_header) {
      ErrorExit<std::__cxx11::string_const&>(loc_00,"%s: medium not defined",__k_01);
    }
    *findMedium.haveScatteringMedia = true;
    local_b0.bits = *(uintptr_t *)(iVar12._M_node + 2);
  }
  pPVar7 = local_308;
  cameraTransform = &(local_308->camera).cameraTransform;
  local_b8 = film.super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits;
  CameraHandle::Create
            (&camera,(string *)&local_308->camera,this_01,(MediumHandle *)&local_b0,cameraTransform,
             (FilmHandle *)&local_b8,loc_00,alloc);
  CreatePrimitivesForShapes.alloc =
       *(Allocator **)
        (*(ulong *)(((ulong)camera.
                            super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                            .bits & 0xffffffffffff) + 0x340) & 0xffffffffffff);
  SamplerHandle::Create
            (&sampler,&(pPVar7->sampler).name,&(pPVar7->sampler).parameters,
             (Point2i *)&CreatePrimitivesForShapes,&(pPVar7->sampler).loc,alloc);
  floatTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &floatTextures._M_t._M_impl.super__Rb_tree_header._M_header;
  floatTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  floatTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  floatTextures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  spectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &spectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header;
  spectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  spectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  spectrumTextures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  floatTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       floatTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  spectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       spectrumTextures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ParsedScene::CreateTextures(pPVar7,&floatTextures,&spectrumTextures,alloc,false);
  namedMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &namedMaterials._M_t._M_impl.super__Rb_tree_header._M_header;
  namedMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  namedMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  namedMaterials._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  materials.super__Vector_base<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  materials.super__Vector_base<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  namedMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       namedMaterials._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ParsedScene::CreateMaterials
            (pPVar7,&floatTextures,&spectrumTextures,alloc,&namedMaterials,&materials);
  pSVar2 = (pPVar7->materials).
           super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar18 = false;
  for (pSVar17 = (pPVar7->materials).
                 super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>._M_impl.
                 super__Vector_impl_data._M_start; pSVar17 != pSVar2; pSVar17 = pSVar17 + 1) {
    iVar11 = std::__cxx11::string::compare((char *)pSVar17);
    if (iVar11 == 0) {
      bVar18 = true;
    }
  }
  ppVar3 = (local_308->namedMaterials).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pPVar7 = local_308;
  for (ppVar20 = (local_308->namedMaterials).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SceneEntity>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; local_308 = pPVar7, ppVar20 != ppVar3;
      ppVar20 = ppVar20 + 1) {
    iVar11 = std::__cxx11::string::compare((char *)&ppVar20->second);
    if (iVar11 == 0) {
      bVar18 = true;
    }
    pPVar7 = local_308;
  }
  lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::reserve
            (&lights,((long)(pPVar7->areaLights).
                            super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pPVar7->areaLights).
                            super__Vector_base<pbrt::SceneEntity,_std::allocator<pbrt::SceneEntity>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x3333333333333333 +
                     ((long)(pPVar7->lights).
                            super__Vector_base<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pPVar7->lights).
                            super__Vector_base<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x4e6a171024e6a171);
  pLVar21 = (pPVar7->lights).
            super__Vector_base<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pLVar4 = (pPVar7->lights).
           super__Vector_base<pbrt::LightSceneEntity,_std::allocator<pbrt::LightSceneEntity>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pLVar21 != pLVar4) {
    __k_02 = &pLVar21->medium;
    do {
      loc_01 = &__k_02[-0x17].field_2;
      if (__k_02->_M_string_length == 0) {
        uVar19 = 0;
      }
      else {
        iVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
                 ::find(&(findMedium.media)->_M_t,__k_02);
        if ((_Rb_tree_header *)iVar12._M_node ==
            &((findMedium.media)->_M_t)._M_impl.super__Rb_tree_header) {
          ErrorExit<std::__cxx11::string_const&>((FileLoc *)loc_01,"%s: medium not defined",__k_02);
        }
        *findMedium.haveScatteringMedia = true;
        uVar19 = *(uintptr_t *)(iVar12._M_node + 2);
      }
      if (__k_02[-0xe].field_2._M_local_buf[0] == '\x01') {
        Warning((FileLoc *)loc_01,"Animated lights aren\'t supported. Using the start transform.");
      }
      local_208.bits = uVar19;
      LightHandle::Create((LightHandle *)&CreatePrimitivesForShapes,
                          (string *)&__k_02[-0x1b]._M_string_length,
                          (ParameterDictionary *)&__k_02[-0x1a]._M_string_length,
                          (Transform *)&__k_02[-0x16]._M_string_length,cameraTransform,
                          (MediumHandle *)&local_208,(FileLoc *)loc_01,alloc);
      if (lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>::
        _M_realloc_insert<pbrt::LightHandle_const&>
                  ((vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>> *)&lights,
                   (iterator)
                   lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                   (LightHandle *)&CreatePrimitivesForShapes);
      }
      else {
        ((lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
          super__Vector_impl_data._M_finish)->
        super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
        ).bits = 0;
        ((lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
          super__Vector_impl_data._M_finish)->
        super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
        ).bits = (uintptr_t)CreatePrimitivesForShapes.alloc;
        lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
        super__Vector_impl_data._M_finish =
             lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      pLVar21 = (pointer)(__k_02 + 1);
      __k_02 = (key_type *)(__k_02[0x1b].field_2._M_local_buf + 8);
    } while (pLVar21 != pLVar4);
  }
  pPVar7 = local_308;
  getAlphaTexture.floatTextures = &floatTextures;
  CreatePrimitivesForShapes.namedMaterials = &namedMaterials;
  CreatePrimitivesForShapes.materials = &materials;
  CreatePrimitivesForShapes.parsedScene = local_308;
  CreatePrimitivesForShapes.alloc = &alloc;
  CreatePrimitivesForShapes.getAlphaTexture = &getAlphaTexture;
  CreatePrimitivesForShapes.findMedium = &findMedium;
  CreatePrimitivesForShapes.lights = &lights;
  getAlphaTexture.alloc = &alloc;
  CPURender::anon_class_56_7_455aa864::operator()
            (&primitives,&CreatePrimitivesForShapes,&local_308->shapes);
  CreatePrimitivesForAnimatedShapes.namedMaterials = &namedMaterials;
  CreatePrimitivesForAnimatedShapes.materials = &materials;
  CreatePrimitivesForAnimatedShapes.parsedScene = pPVar7;
  CreatePrimitivesForAnimatedShapes.alloc = &alloc;
  CreatePrimitivesForAnimatedShapes.getAlphaTexture = &getAlphaTexture;
  CreatePrimitivesForAnimatedShapes.findMedium = &findMedium;
  CreatePrimitivesForAnimatedShapes.lights = &lights;
  CPURender::anon_class_56_7_455aa864::operator()
            (&animatedPrimitives,&CreatePrimitivesForAnimatedShapes,&pPVar7->animatedShapes);
  std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<pbrt::PrimitiveHandle*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>>>
            ((vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>> *)&primitives,
             primitives.
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             animatedPrimitives.
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
             _M_impl.super__Vector_impl_data._M_start,
             animatedPrimitives.
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  instanceDefinitions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &instanceDefinitions._M_t._M_impl.super__Rb_tree_header._M_header;
  instanceDefinitions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  instanceDefinitions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  instanceDefinitions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  instanceDefinitions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       instanceDefinitions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var15 = (pPVar7->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var15 !=
      &(pPVar7->instanceDefinitions)._M_t._M_impl.super__Rb_tree_header;
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
    __k = p_Var15 + 1;
    iVar13 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
             ::find(&instanceDefinitions._M_t,(key_type *)__k);
    if ((_Rb_tree_header *)iVar13._M_node != &instanceDefinitions._M_t._M_impl.super__Rb_tree_header
       ) {
      ErrorExit<std::__cxx11::string_const&>
                ("%s: object instance redefined",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
    }
    CPURender::anon_class_56_7_455aa864::operator()
              (&instancePrimitives,&CreatePrimitivesForShapes,
               (vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *)
               &p_Var15[3]._M_right);
    CPURender::anon_class_56_7_455aa864::operator()
              ((vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *)&integrator,
               &CreatePrimitivesForAnimatedShapes,
               (vector<pbrt::AnimatedShapeSceneEntity,_std::allocator<pbrt::AnimatedShapeSceneEntity>_>
                *)&p_Var15[4]._M_left);
    std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<pbrt::PrimitiveHandle*,std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>>>
              ((vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>> *)
               &instancePrimitives,
               instancePrimitives.
               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               integrator._M_t.
               super___uniq_ptr_impl<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_>._M_t.
               super__Tuple_impl<0UL,_pbrt::Integrator_*,_std::default_delete<pbrt::Integrator>_>.
               super__Head_base<0UL,_pbrt::Integrator_*,_false>._M_head_impl);
    pPVar9 = instancePrimitives.
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pPVar8 = instancePrimitives.
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (instancePrimitives.
        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
        super__Vector_impl_data._M_start ==
        instancePrimitives.
        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
                ::operator[](&instanceDefinitions,(key_type *)__k);
      (pmVar14->
      super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
      ).bits = 0;
    }
    else {
      if (8 < (ulong)((long)instancePrimitives.
                            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)instancePrimitives.
                           super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                           ._M_impl.super__Vector_impl_data._M_start)) {
        this = (BVHAggregate *)operator_new(0x30);
        local_270.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
        _M_impl.super__Vector_impl_data._M_start = pPVar8;
        local_270.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
        _M_impl.super__Vector_impl_data._M_finish = pPVar9;
        local_270.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             instancePrimitives.
             super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        instancePrimitives.
        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        instancePrimitives.
        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        instancePrimitives.
        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        BVHAggregate::BVHAggregate(this,&local_270,1,SAH);
        bvh.
        super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
        .bits = (TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                 )((ulong)this | 0x5000000000000);
        if ((pointer)local_270.
                     super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_270.
                          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_270.
                                super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_270.
                                super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (instancePrimitives.
            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            instancePrimitives.
            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          instancePrimitives.
          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
          super__Vector_impl_data._M_finish =
               instancePrimitives.
               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        if (instancePrimitives.
            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            instancePrimitives.
            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>>::
          _M_realloc_insert<pbrt::PrimitiveHandle_const&>
                    ((vector<pbrt::PrimitiveHandle,std::allocator<pbrt::PrimitiveHandle>> *)
                     &instancePrimitives,
                     (iterator)
                     instancePrimitives.
                     super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&bvh);
        }
        else {
          ((instancePrimitives.
            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
            _M_impl.super__Vector_impl_data._M_finish)->
          super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
          ).bits = 0;
          ((instancePrimitives.
            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
            _M_impl.super__Vector_impl_data._M_finish)->
          super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
          ).bits = (uintptr_t)bvh;
          instancePrimitives.
          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
          super__Vector_impl_data._M_finish =
               instancePrimitives.
               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      pPVar8 = instancePrimitives.
               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
                ::operator[](&instanceDefinitions,(key_type *)__k);
      (pmVar14->
      super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
      ).bits = (pPVar8->
               super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
               ).bits;
    }
    if ((__uniq_ptr_impl<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_>)
        integrator._M_t.
        super___uniq_ptr_impl<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_>._M_t.
        super__Tuple_impl<0UL,_pbrt::Integrator_*,_std::default_delete<pbrt::Integrator>_>.
        super__Head_base<0UL,_pbrt::Integrator_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_>)0x0) {
      operator_delete((void *)integrator._M_t.
                              super___uniq_ptr_impl<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_pbrt::Integrator_*,_std::default_delete<pbrt::Integrator>_>
                              .super__Head_base<0UL,_pbrt::Integrator_*,_false>._M_head_impl,
                      (long)local_288 -
                      (long)integrator._M_t.
                            super___uniq_ptr_impl<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pbrt::Integrator_*,_std::default_delete<pbrt::Integrator>_>
                            .super__Head_base<0UL,_pbrt::Integrator_*,_false>._M_head_impl);
    }
    if (instancePrimitives.
        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(instancePrimitives.
                      super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)instancePrimitives.
                            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)instancePrimitives.
                            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  __k_00 = (local_308->instances).
           super__Vector_base<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar5 = (local_308->instances).
           super__Vector_base<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__k_00 != pIVar5) {
    do {
      iVar13 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
               ::find(&instanceDefinitions._M_t,(key_type *)__k_00);
      if ((_Rb_tree_header *)iVar13._M_node ==
          &instanceDefinitions._M_t._M_impl.super__Rb_tree_header) {
        ErrorExit<std::__cxx11::string_const&>
                  (&(__k_00->super_SceneEntity).loc,"%s: object instance not defined",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k_00);
      }
      if (*(long *)(iVar13._M_node + 2) != 0) {
        if (__k_00->renderFromInstance == (Transform *)0x0) {
          this_00 = (AnimatedPrimitive *)operator_new(0x2c0);
          local_280.bits = *(uintptr_t *)(iVar13._M_node + 2);
          AnimatedPrimitive::AnimatedPrimitive
                    (this_00,(PrimitiveHandle *)&local_280,&__k_00->renderFromInstanceAnim);
          instancePrimitives.
          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)((ulong)this_00 | 0x4000000000000);
          std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::
          emplace_back<pbrt::PrimitiveHandle>(&primitives,(PrimitiveHandle *)&instancePrimitives);
        }
        else {
          puVar16 = (undefined8 *)operator_new(0x10);
          pTVar6 = __k_00->renderFromInstance;
          *puVar16 = *(undefined8 *)(iVar13._M_node + 2);
          puVar16[1] = pTVar6;
          *(long *)(in_FS_OFFSET + -0x5a0) = *(long *)(in_FS_OFFSET + -0x5a0) + 0x10;
          instancePrimitives.
          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)((ulong)puVar16 | 0x3000000000000);
          std::vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>::
          emplace_back<pbrt::PrimitiveHandle>(&primitives,(PrimitiveHandle *)&instancePrimitives);
        }
      }
      __k_00 = __k_00 + 1;
    } while (__k_00 != pIVar5);
  }
  if (primitives.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      primitives.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_220.bits = 0;
  }
  else {
    local_198.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
    _M_impl.super__Vector_impl_data._M_start =
         primitives.
         super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_198.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         primitives.
         super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_198.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         primitives.
         super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    primitives.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    primitives.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    primitives.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CreateAccelerator((pbrt *)&instancePrimitives,&(local_308->accelerator).name,&local_198,
                      &(local_308->accelerator).parameters);
    local_220.bits =
         (uintptr_t)
         instancePrimitives.
         super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
         super__Vector_impl_data._M_start;
    if (local_198.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_198.
                      super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_198.
                            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.
                            super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  pPVar7 = local_308;
  colorSpace = (local_308->film).parameters.colorSpace;
  local_210 = camera.
              super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
              .bits;
  local_218 = sampler.
              super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
              .bits;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector(&local_1b0,&lights);
  name_00 = &pPVar7->integrator;
  Integrator::Create((Integrator *)&integrator,&name_00->name,&(pPVar7->integrator).parameters,
                     (CameraHandle *)&local_210,(SamplerHandle *)&local_218,
                     (PrimitiveHandle *)&local_220,&local_1b0,colorSpace,&(pPVar7->integrator).loc);
  if (local_1b0.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.
                    super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1b0.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1b0.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((((haveScatteringMedia == true) &&
       (iVar11 = std::__cxx11::string::compare((char *)name_00), iVar11 != 0)) &&
      (iVar11 = std::__cxx11::string::compare((char *)name_00), iVar11 != 0)) &&
     ((iVar11 = std::__cxx11::string::compare((char *)name_00), iVar11 != 0 &&
      (iVar11 = std::__cxx11::string::compare((char *)name_00), iVar11 != 0)))) {
    ppPVar1 = &instancePrimitives.
               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    instancePrimitives.
    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    instancePrimitives.
    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)instancePrimitives.
                          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    instancePrimitives.
    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppPVar1;
    detail::stringPrintfRecursive<std::__cxx11::string&>
              ((string *)&instancePrimitives,
               "Scene has scattering media but \"%s\" integrator doesn\'t support volume scattering. Consider using \"volpath\", \"simplevolpath\", \"bdpt\", or \"mlt\"."
               ,&name_00->name);
    Warning((FileLoc *)0x0,
            (char *)instancePrimitives.
                    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    if (instancePrimitives.
        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppPVar1) {
      operator_delete(instancePrimitives.
                      super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((instancePrimitives.
                                       super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                                     ).bits + 1));
    }
  }
  bVar22 = lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
           super__Vector_impl_data._M_start !=
           lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (p_Var15 = media._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var15 != &media._M_t._M_impl.super__Rb_tree_header;
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15)) {
    bVar10 = MediumHandle::IsEmissive((MediumHandle *)(p_Var15 + 2));
    bVar22 = (bool)(bVar22 | bVar10);
  }
  if (((bVar22 == false) && (iVar11 = std::__cxx11::string::compare((char *)name_00), iVar11 != 0))
     && (iVar11 = std::__cxx11::string::compare((char *)name_00), iVar11 != 0)) {
    ppPVar1 = &instancePrimitives.
               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    instancePrimitives.
    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    instancePrimitives.
    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)instancePrimitives.
                          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    instancePrimitives.
    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppPVar1;
    detail::stringPrintfRecursive
              ((string *)&instancePrimitives,
               "No light sources defined in scene; rendering a black image.");
    Warning((FileLoc *)0x0,
            (char *)instancePrimitives.
                    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    if (instancePrimitives.
        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppPVar1) {
      operator_delete(instancePrimitives.
                      super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((instancePrimitives.
                                       super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                                     ).bits + 1));
    }
  }
  iVar11 = std::__cxx11::string::compare((char *)name);
  if ((iVar11 == 0) && (iVar11 = std::__cxx11::string::compare((char *)name_00), iVar11 != 0)) {
    ppPVar1 = &instancePrimitives.
               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    instancePrimitives.
    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    instancePrimitives.
    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)instancePrimitives.
                          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    instancePrimitives.
    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppPVar1;
    detail::stringPrintfRecursive<std::__cxx11::string&>
              ((string *)&instancePrimitives,
               "GBufferFilm is not supported by %s. The channels other than R, G, B will be zero.",
               &name_00->name);
    Warning(loc,(char *)instancePrimitives.
                        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    if (instancePrimitives.
        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppPVar1) {
      operator_delete(instancePrimitives.
                      super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((instancePrimitives.
                                       super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                                     ).bits + 1));
    }
  }
  if ((bVar18) && (iVar11 = std::__cxx11::string::compare((char *)name_00), iVar11 != 0)) {
    ppPVar1 = &instancePrimitives.
               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    instancePrimitives.
    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    instancePrimitives.
    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)instancePrimitives.
                          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    instancePrimitives.
    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppPVar1;
    detail::stringPrintfRecursive<std::__cxx11::string&>
              ((string *)&instancePrimitives,
               "Some objects in the scene have subsurface scattering, which is not supported by the %s integrator. Use the \"volpath\" integrator to render them correctly."
               ,&name_00->name);
    Warning((FileLoc *)0x0,
            (char *)instancePrimitives.
                    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    if (instancePrimitives.
        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppPVar1) {
      operator_delete(instancePrimitives.
                      super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((instancePrimitives.
                                       super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                                     ).bits + 1));
    }
  }
  if (LOGGING_LogLevel < 1) {
    bvh.
    super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
    .bits = (TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
             )GetCurrentRSS();
    ppPVar1 = &instancePrimitives.
               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    instancePrimitives.
    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    instancePrimitives.
    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)instancePrimitives.
                          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    instancePrimitives.
    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppPVar1;
    detail::stringPrintfRecursive<unsigned_long>
              ((string *)&instancePrimitives,"Memory used after scene creation: %d",
               (unsigned_long *)&bvh);
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/render.cpp"
        ,0x152,(char *)instancePrimitives.
                       super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (instancePrimitives.
        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppPVar1) {
      operator_delete(instancePrimitives.
                      super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((instancePrimitives.
                                       super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                                     ).bits + 1));
    }
  }
  (**(code **)(*(long *)integrator._M_t.
                        super___uniq_ptr_impl<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_pbrt::Integrator_*,_std::default_delete<pbrt::Integrator>_>
                        .super__Head_base<0UL,_pbrt::Integrator_*,_false>._M_head_impl + 0x18))();
  if (LOGGING_LogLevel < 1) {
    bvh.
    super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
    .bits = (TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
             )GetCurrentRSS();
    ppPVar1 = &instancePrimitives.
               super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    instancePrimitives.
    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    instancePrimitives.
    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)instancePrimitives.
                          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    instancePrimitives.
    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppPVar1;
    detail::stringPrintfRecursive<unsigned_long>
              ((string *)&instancePrimitives,"Memory used after rendering: %s",(unsigned_long *)&bvh
              );
    Log(Verbose,
        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/render.cpp"
        ,0x157,(char *)instancePrimitives.
                       super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (instancePrimitives.
        super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppPVar1) {
      operator_delete(instancePrimitives.
                      super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((instancePrimitives.
                                       super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
                                     ).bits + 1));
    }
  }
  PtexTextureBase::ReportStats();
  std::
  _Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
  ::clear((_Rb_tree<pbrt::TexInfo,_std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>,_std::_Select1st<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>,_std::less<pbrt::TexInfo>,_std::allocator<std::pair<const_pbrt::TexInfo,_std::unique_ptr<pbrt::MIPMap,_std::default_delete<pbrt::MIPMap>_>_>_>_>
           *)ImageTextureBase::textureCache);
  FreeBufferCaches();
  if ((__uniq_ptr_impl<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_>)
      integrator._M_t.
      super___uniq_ptr_impl<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_>._M_t.
      super__Tuple_impl<0UL,_pbrt::Integrator_*,_std::default_delete<pbrt::Integrator>_>.
      super__Head_base<0UL,_pbrt::Integrator_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_>)0x0) {
    (**(code **)(*(long *)integrator._M_t.
                          super___uniq_ptr_impl<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_pbrt::Integrator_*,_std::default_delete<pbrt::Integrator>_>
                          .super__Head_base<0UL,_pbrt::Integrator_*,_false>._M_head_impl + 8))();
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::PrimitiveHandle>_>_>
  ::~_Rb_tree(&instanceDefinitions._M_t);
  if (animatedPrimitives.
      super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(animatedPrimitives.
                    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)animatedPrimitives.
                          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)animatedPrimitives.
                          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (primitives.super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(primitives.
                    super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)primitives.
                          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)primitives.
                          super__Vector_base<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(lights.super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)lights.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)lights.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (materials.super__Vector_base<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(materials.
                    super__Vector_base<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)materials.
                          super__Vector_base<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)materials.
                          super__Vector_base<pbrt::MaterialHandle,_std::allocator<pbrt::MaterialHandle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MaterialHandle>_>_>
  ::~_Rb_tree(&namedMaterials._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
  ::~_Rb_tree(&spectrumTextures._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::FloatTextureHandle>_>_>
  ::~_Rb_tree(&floatTextures._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::MediumHandle>_>_>
  ::~_Rb_tree(&media._M_t);
  return;
}

Assistant:

void CPURender(ParsedScene &parsedScene) {
    Allocator alloc;

    // Create media first (so have them for the camera...)
    std::map<std::string, MediumHandle> media = parsedScene.CreateMedia(alloc);

    bool haveScatteringMedia = false;
    auto findMedium = [&media, &haveScatteringMedia](const std::string &s,
                                                     const FileLoc *loc) -> MediumHandle {
        if (s.empty())
            return nullptr;

        auto iter = media.find(s);
        if (iter == media.end())
            ErrorExit(loc, "%s: medium not defined", s);
        haveScatteringMedia = true;
        return iter->second;
    };

    // Filter
    FilterHandle filter =
        FilterHandle::Create(parsedScene.filter.name, parsedScene.filter.parameters,
                             &parsedScene.filter.loc, alloc);

    // Film
    // It's a little ugly to poke into the camera's parameters here, but we
    // have this circular dependency that CameraHandle::Create() expects a
    // FilmHandle, yet now the film needs to know the exposure time from
    // the camera....
    Float exposureTime = parsedScene.camera.parameters.GetOneFloat("shutterclose", 1.f) -
                         parsedScene.camera.parameters.GetOneFloat("shutteropen", 0.f);
    if (exposureTime <= 0)
        ErrorExit(&parsedScene.camera.loc,
                  "The specified camera shutter times imply that the shutter "
                  "does not open.  A black image will result.");
    FilmHandle film =
        FilmHandle::Create(parsedScene.film.name, parsedScene.film.parameters,
                           exposureTime, filter, &parsedScene.film.loc, alloc);

    // Camera
    MediumHandle cameraMedium =
        findMedium(parsedScene.camera.medium, &parsedScene.camera.loc);
    CameraHandle camera = CameraHandle::Create(
        parsedScene.camera.name, parsedScene.camera.parameters, cameraMedium,
        parsedScene.camera.cameraTransform, film, &parsedScene.camera.loc, alloc);

    // Create _Sampler_ for rendering
    SamplerHandle sampler = SamplerHandle::Create(
        parsedScene.sampler.name, parsedScene.sampler.parameters,
        camera.GetFilm().FullResolution(), &parsedScene.sampler.loc, alloc);

    // Textures
    std::map<std::string, FloatTextureHandle> floatTextures;
    std::map<std::string, SpectrumTextureHandle> spectrumTextures;
    parsedScene.CreateTextures(&floatTextures, &spectrumTextures, alloc, false);

    // Materials
    std::map<std::string, MaterialHandle> namedMaterials;
    std::vector<MaterialHandle> materials;
    parsedScene.CreateMaterials(floatTextures, spectrumTextures, alloc, &namedMaterials,
                                &materials);
    bool haveSubsurface = false;
    for (const auto &mtl : parsedScene.materials)
        if (mtl.name == "subsurface")
            haveSubsurface = true;
    for (const auto &namedMtl : parsedScene.namedMaterials)
        if (namedMtl.second.name == "subsurface")
            haveSubsurface = true;

    // Lights (area lights will be done later, with shapes...)
    std::vector<LightHandle> lights;
    lights.reserve(parsedScene.lights.size() + parsedScene.areaLights.size());
    for (const auto &light : parsedScene.lights) {
        MediumHandle outsideMedium = findMedium(light.medium, &light.loc);
        if (light.renderFromObject.IsAnimated())
            Warning(&light.loc,
                    "Animated lights aren't supported. Using the start transform.");
        LightHandle l = LightHandle::Create(
            light.name, light.parameters, light.renderFromObject.startTransform,
            parsedScene.camera.cameraTransform, outsideMedium, &light.loc, alloc);
        lights.push_back(l);
    }

    // Primitives
    auto getAlphaTexture = [&](const ParameterDictionary &parameters,
                               const FileLoc *loc) -> FloatTextureHandle {
        std::string alphaTexName = parameters.GetTexture("alpha");
        if (!alphaTexName.empty()) {
            if (floatTextures.find(alphaTexName) != floatTextures.end())
                return floatTextures[alphaTexName];
            else
                ErrorExit(loc, "%s: couldn't find float texture for \"alpha\" parameter.",
                          alphaTexName);
        } else if (parameters.GetOneFloat("alpha", 1.f) == 0.f)
            return alloc.new_object<FloatConstantTexture>(0.f);
        else
            return nullptr;
    };

    // Non-animated shapes
    auto CreatePrimitivesForShapes =
        [&](const std::vector<ShapeSceneEntity> &shapes) -> std::vector<PrimitiveHandle> {
        std::vector<PrimitiveHandle> primitives;
        for (const auto &sh : shapes) {
            pstd::vector<ShapeHandle> shapes =
                ShapeHandle::Create(sh.name, sh.renderFromObject, sh.objectFromRender,
                                    sh.reverseOrientation, sh.parameters, &sh.loc, alloc);
            if (shapes.empty())
                continue;

            FloatTextureHandle alphaTex = getAlphaTexture(sh.parameters, &sh.loc);
            sh.parameters.ReportUnused();  // do now so can grab alpha...

            MaterialHandle mtl = nullptr;
            if (!sh.materialName.empty()) {
                auto iter = namedMaterials.find(sh.materialName);
                if (iter == namedMaterials.end())
                    ErrorExit(&sh.loc, "%s: no named material defined.", sh.materialName);
                mtl = iter->second;
            } else {
                CHECK_LT(sh.materialIndex, materials.size());
                mtl = materials[sh.materialIndex];
            }

            MediumInterface mi(findMedium(sh.insideMedium, &sh.loc),
                               findMedium(sh.outsideMedium, &sh.loc));

            for (auto &s : shapes) {
                // Possibly create area light for shape
                LightHandle areaHandle = nullptr;
                if (sh.lightIndex != -1) {
                    CHECK_LT(sh.lightIndex, parsedScene.areaLights.size());
                    const auto &areaLightEntity = parsedScene.areaLights[sh.lightIndex];

                    LightHandle area = LightHandle::CreateArea(
                        areaLightEntity.name, areaLightEntity.parameters,
                        *sh.renderFromObject, mi, s, &areaLightEntity.loc, Allocator{});
                    areaHandle = area;
                    if (area)
                        lights.push_back(area);
                }
                if (areaHandle == nullptr && !mi.IsMediumTransition() && !alphaTex)
                    primitives.push_back(new SimplePrimitive(s, mtl));
                else
                    primitives.push_back(
                        new GeometricPrimitive(s, mtl, areaHandle, mi, alphaTex));
            }
        }
        return primitives;
    };

    std::vector<PrimitiveHandle> primitives =
        CreatePrimitivesForShapes(parsedScene.shapes);

    // Animated shapes
    auto CreatePrimitivesForAnimatedShapes =
        [&](const std::vector<AnimatedShapeSceneEntity> &shapes)
        -> std::vector<PrimitiveHandle> {
        std::vector<PrimitiveHandle> primitives;
        primitives.reserve(shapes.size());

        for (const auto &sh : shapes) {
            pstd::vector<ShapeHandle> shapes =
                ShapeHandle::Create(sh.name, sh.identity, sh.identity,
                                    sh.reverseOrientation, sh.parameters, &sh.loc, alloc);
            if (shapes.empty())
                continue;

            FloatTextureHandle alphaTex = getAlphaTexture(sh.parameters, &sh.loc);
            sh.parameters.ReportUnused();  // do now so can grab alpha...

            // Create initial shape or shapes for animated shape

            MaterialHandle mtl = nullptr;
            if (!sh.materialName.empty()) {
                auto iter = namedMaterials.find(sh.materialName);
                if (iter == namedMaterials.end())
                    ErrorExit(&sh.loc, "%s: no named material defined.", sh.materialName);
                mtl = iter->second;
            } else {
                CHECK_LT(sh.materialIndex, materials.size());
                mtl = materials[sh.materialIndex];
            }

            MediumInterface mi(findMedium(sh.insideMedium, &sh.loc),
                               findMedium(sh.outsideMedium, &sh.loc));

            std::vector<PrimitiveHandle> prims;
            for (auto &s : shapes) {
                // Possibly create area light for shape
                LightHandle areaHandle = nullptr;
                if (sh.lightIndex != -1) {
                    CHECK_LT(sh.lightIndex, parsedScene.areaLights.size());
                    const auto &areaLightEntity = parsedScene.areaLights[sh.lightIndex];

                    if (sh.renderFromObject.IsAnimated())
                        Warning(&sh.loc, "Animated area lights aren't supported. Using "
                                         "the start transform.");

                    LightHandle area = LightHandle::CreateArea(
                        areaLightEntity.name, areaLightEntity.parameters,
                        sh.renderFromObject.startTransform, mi, s, &sh.loc, Allocator{});
                    areaHandle = area;
                    if (area)
                        lights.push_back(area);
                }
                if (areaHandle == nullptr && !mi.IsMediumTransition() && !alphaTex)
                    prims.push_back(new SimplePrimitive(s, mtl));
                else
                    prims.push_back(
                        new GeometricPrimitive(s, mtl, areaHandle, mi, alphaTex));
            }

            // TODO: could try to be greedy or even segment them according
            // to same sh.renderFromObject...

            // Create single _Primitive_ for _prims_
            if (prims.size() > 1) {
                PrimitiveHandle bvh = new BVHAggregate(std::move(prims));
                prims.clear();
                prims.push_back(bvh);
            }
            primitives.push_back(new AnimatedPrimitive(prims[0], sh.renderFromObject));
        }
        return primitives;
    };
    std::vector<PrimitiveHandle> animatedPrimitives =
        CreatePrimitivesForAnimatedShapes(parsedScene.animatedShapes);
    primitives.insert(primitives.end(), animatedPrimitives.begin(),
                      animatedPrimitives.end());

    // Instance definitions
    std::map<std::string, PrimitiveHandle> instanceDefinitions;
    for (const auto &inst : parsedScene.instanceDefinitions) {
        if (instanceDefinitions.find(inst.first) != instanceDefinitions.end())
            ErrorExit("%s: object instance redefined", inst.first);

        std::vector<PrimitiveHandle> instancePrimitives =
            CreatePrimitivesForShapes(inst.second.shapes);
        std::vector<PrimitiveHandle> movingInstancePrimitives =
            CreatePrimitivesForAnimatedShapes(inst.second.animatedShapes);
        instancePrimitives.insert(instancePrimitives.end(),
                                  movingInstancePrimitives.begin(),
                                  movingInstancePrimitives.end());
        if (instancePrimitives.empty()) {
            instanceDefinitions[inst.first] = nullptr;
        } else {
            if (instancePrimitives.size() > 1) {
                PrimitiveHandle bvh = new BVHAggregate(std::move(instancePrimitives));
                instancePrimitives.clear();
                instancePrimitives.push_back(bvh);
            }
            instanceDefinitions[inst.first] = instancePrimitives[0];
        }
    }

    // Instances
    for (const auto &inst : parsedScene.instances) {
        auto iter = instanceDefinitions.find(inst.name);
        if (iter == instanceDefinitions.end())
            ErrorExit(&inst.loc, "%s: object instance not defined", inst.name);

        if (iter->second == nullptr)
            // empty instance
            continue;

        if (inst.renderFromInstance)
            primitives.push_back(
                new TransformedPrimitive(iter->second, inst.renderFromInstance));
        else
            primitives.push_back(
                new AnimatedPrimitive(iter->second, inst.renderFromInstanceAnim));
    }

    // Accelerator
    PrimitiveHandle accel = nullptr;
    if (!primitives.empty())
        accel = CreateAccelerator(parsedScene.accelerator.name, std::move(primitives),
                                  parsedScene.accelerator.parameters);

    // Integrator
    const RGBColorSpace *integratorColorSpace = parsedScene.film.parameters.ColorSpace();
    std::unique_ptr<Integrator> integrator(Integrator::Create(
        parsedScene.integrator.name, parsedScene.integrator.parameters, camera, sampler,
        accel, lights, integratorColorSpace, &parsedScene.integrator.loc));

    // Helpful warnings
    if (haveScatteringMedia && parsedScene.integrator.name != "volpath" &&
        parsedScene.integrator.name != "simplevolpath" &&
        parsedScene.integrator.name != "bdpt" && parsedScene.integrator.name != "mlt")
        Warning("Scene has scattering media but \"%s\" integrator doesn't support "
                "volume scattering. Consider using \"volpath\", \"simplevolpath\", "
                "\"bdpt\", or \"mlt\".",
                parsedScene.integrator.name);

    bool haveLights = !lights.empty();
    for (const auto &m : media)
        haveLights |= m.second.IsEmissive();

    if (!haveLights && parsedScene.integrator.name != "ambientocclusion" &&
        parsedScene.integrator.name != "aov")
        Warning("No light sources defined in scene; rendering a black image.");

    if (parsedScene.film.name == "gbuffer" && parsedScene.integrator.name != "path")
        Warning(&parsedScene.film.loc,
                "GBufferFilm is not supported by %s. The channels "
                "other than R, G, B will be zero.",
                parsedScene.integrator.name);

    if (haveSubsurface && parsedScene.integrator.name != "volpath")
        Warning("Some objects in the scene have subsurface scattering, which is "
                "not supported by the %s integrator. Use the \"volpath\" integrator "
                "to render them correctly.",
                parsedScene.integrator.name);

    LOG_VERBOSE("Memory used after scene creation: %d", GetCurrentRSS());

    // Render!
    integrator->Render();

    LOG_VERBOSE("Memory used after rendering: %s", GetCurrentRSS());

    PtexTextureBase::ReportStats();
    ImageTextureBase::ClearCache();
    FreeBufferCaches();
}